

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_buffer.c
# Opt level: O3

int buffer_seek(buffer_t *buffer,void *data,zip_uint64_t len,zip_error_t *error)

{
  int iVar1;
  zip_uint64_t zVar2;
  
  zVar2 = zip_source_seek_compute_offset(buffer->offset,buffer->size,data,len,error);
  if ((long)zVar2 < 0) {
    iVar1 = -1;
  }
  else {
    buffer->offset = zVar2;
    zVar2 = buffer_find_fragment(buffer,zVar2);
    buffer->current_fragment = zVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
buffer_seek(buffer_t *buffer, void *data, zip_uint64_t len, zip_error_t *error) {
    zip_int64_t new_offset = zip_source_seek_compute_offset(buffer->offset, buffer->size, data, len, error);

    if (new_offset < 0) {
	return -1;
    }

    buffer->offset = (zip_uint64_t)new_offset;
    buffer->current_fragment = buffer_find_fragment(buffer, buffer->offset);
    return 0;
}